

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::diceHistoricalResolvedValues(Dice *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  difference_type dVar5;
  pointer pmVar6;
  pointer ppVar7;
  _Self local_38;
  _Self local_30;
  iterator mapIt;
  __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
  local_20;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_18;
  Dice *local_10;
  Dice *this_local;
  
  local_10 = this;
  poVar3 = std::operator<<((ostream *)&std::cout,"Dice container values for player ");
  iVar2 = getPlayerNumber(this);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "-----------------------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_18 = (map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
              *)std::
                vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                ::begin(&this->historyOfResolvedRolls);
  (this->it)._M_current = local_18;
  while( true ) {
    local_20._M_current =
         (map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
          *)std::
            vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
            ::end(&this->historyOfResolvedRolls);
    bVar1 = __gnu_cxx::operator!=(&this->it,&local_20);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Dice Roll # ");
    mapIt._M_node =
         (_Base_ptr)
         std::
         vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
         ::begin(&this->historyOfResolvedRolls);
    dVar5 = __gnu_cxx::operator-
                      (&this->it,
                       (__normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
                        *)&mapIt);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,dVar5 + 1);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pmVar6 = __gnu_cxx::
             __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
             ::operator->(&this->it);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
         ::begin(pmVar6);
    while( true ) {
      pmVar6 = __gnu_cxx::
               __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
               ::operator->(&this->it);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::end(pmVar6);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::operator->
                         (&local_30);
      poVar3 = std::operator<<((ostream *)&std::cout,this->DiceNames[ppVar7->first]);
      poVar3 = std::operator<<(poVar3,", ");
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::operator->
                         (&local_30);
      pvVar4 = (void *)std::ostream::operator<<(poVar3,ppVar7->second);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_iterator<std::pair<const_Dice::DiceOptions,_int>_>::operator++(&local_30);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "-----------------------------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_*,_std::vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>_>
    ::operator++(&this->it);
  }
  return;
}

Assistant:

void Dice::diceHistoricalResolvedValues()
{
    cout << "Dice container values for player "<< this->getPlayerNumber() << endl;
    cout << "-----------------------------------------------------------------" << endl;
    for (it = historyOfResolvedRolls.begin(); it != historyOfResolvedRolls.end(); ++it) {
        cout << "Dice Roll # "<< it - historyOfResolvedRolls.begin() +1 << endl;
        cout << "-----------------------------------------------------------------" << endl;

        for (auto mapIt(it->begin()); mapIt != it->end(); ++mapIt) {

            std::cout << DiceNames[mapIt->first] << ", " << mapIt->second << std::endl;
        }
        cout << "-----------------------------------------------------------------" << endl;

    }

}